

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<bool> *
cmJSONHelperBuilder::Bool
          (cmJSONHelper<bool> *__return_storage_ptr__,ErrorGenerator *error,bool defval)

{
  anon_class_40_2_ce0a3bf5 local_48;
  byte local_19;
  ErrorGenerator *pEStack_18;
  bool defval_local;
  ErrorGenerator *error_local;
  
  local_19 = defval;
  pEStack_18 = error;
  error_local = (ErrorGenerator *)__return_storage_ptr__;
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function(&local_48.error,error);
  local_48.defval = (bool)(local_19 & 1);
  std::function<bool(bool&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Bool(std::function<void(Json::Value_const*,cmJSONState*)>const&,bool)::_lambda(bool&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(bool&,Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             &local_48);
  Bool(std::function<void(Json::Value_const*,cmJSONState*)>const&,bool)::
  {lambda(bool&,Json::Value_const*,cmJSONState*)#1}::~function
            ((_lambda_bool__Json__Value_const__cmJSONState___1_ *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<bool> Bool(
    const JsonErrors::ErrorGenerator& error = JsonErrors::INVALID_BOOL,
    bool defval = false)
  {
    return [error, defval](bool& out, const Json::Value* value,
                           cmJSONState* state) -> bool {
      if (!value) {
        out = defval;
        return true;
      }
      if (!value->isBool()) {
        error(value, state);
        ;
        return false;
      }
      out = value->asBool();
      return true;
    };
  }